

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnionFind.h
# Opt level: O0

int __thiscall covenant::UnionFind::lookup(UnionFind *this,int id)

{
  int iVar1;
  reference pvVar2;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int ret;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)in_ESI);
  local_4 = in_ESI;
  if (*pvVar2 != in_ESI) {
    std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)in_ESI);
    iVar1 = lookup((UnionFind *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                   (int)((ulong)in_RDI >> 0x20));
    local_4 = iVar1;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)in_ESI);
    *pvVar2 = iVar1;
  }
  return local_4;
}

Assistant:

int lookup(int id){
      if(mapping[id] == id)
        return id;
      int ret = lookup(mapping[id]);
      mapping[id] = ret;
      return ret;
    }